

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMapNoLock(MapFieldBase *this)

{
  Rep *this_00;
  RepeatedPtrField<google::protobuf::Message> *this_01;
  MapFieldBase *this_local;
  RepeatedPtrField<google::protobuf::Message> *local_48;
  RepeatedPtrField<google::protobuf::Message> local_40;
  RepeatedPtrField<google::protobuf::Message> *local_28;
  RepeatedPtrField<google::protobuf::Message> *t;
  byte local_11;
  Rep *local_10;
  
  if (this->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    this_00 = (Rep *)this->arena_;
    if (this_00 == (Rep *)0x0) {
      local_48 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField(local_48);
    }
    else {
      local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.rep_ = this_00;
      local_11 = Arena::
                 SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::Message>>(0);
      t = &local_40;
      local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)this_00;
      local_10 = this_00;
      this_01 = (RepeatedPtrField<google::protobuf::Message> *)
                Arena::AllocateAligned
                          ((Arena *)this_00,
                           (type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18)
      ;
      RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                (this_01,(t->super_RepeatedPtrFieldBase).arena_);
      local_28 = this_01;
      if ((local_11 & 1) == 0) {
        Arena::AddListNode((Arena *)this_00,this_01,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                          );
      }
      local_48 = local_28;
    }
    this->repeated_field_ = local_48;
  }
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMapNoLock() const {
  if (repeated_field_ == NULL) {
    repeated_field_ = Arena::CreateMessage<RepeatedPtrField<Message> >(arena_);
  }
}